

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
* __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
::copy_assign_impl(vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
                   *this,vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
                         *rhs)

{
  elem_ptr_const_pointer begin;
  void_pointer pvVar1;
  size_t max_align;
  elem_ptr_pointer pvVar2;
  elem_ptr_pointer pvVar3;
  undefined1 auVar4 [16];
  poly_copy_descr local_38;
  
  pvVar3 = (elem_ptr_pointer)
           (this->
           super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
           )._storage;
  pvVar2 = this->_free_elem;
  if (pvVar2 != pvVar3) {
    do {
      (*((pvVar3->ptr).second)->_vptr_Interface[3])();
      (pvVar3->ptr).second = (Interface *)0x0;
      (pvVar3->sf).first = 0;
      (pvVar3->
      super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
      ).
      super_delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>
      .cf = (clone_func_ptr_t)0x0;
      (pvVar3->ptr).first = (void *)0x0;
      (pvVar3->sf).second = 0;
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar2);
    pvVar3 = (elem_ptr_pointer)
             (this->
             super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
             )._storage;
  }
  this->_align_max = 8;
  pvVar2 = pvVar3;
  if (((ulong)((long)this->_begin_storage - (long)pvVar3) / 5 & 0xfffffffffffffff8) * 5 != 0) {
    do {
      (pvVar2->sf).first = 0;
      (pvVar2->sf).second = 0;
      (pvVar2->ptr).first = (void *)0x0;
      (pvVar2->ptr).second = (Interface *)0x0;
      pvVar2 = pvVar2 + 1;
      pvVar3 = (elem_ptr_pointer)
               (this->
               super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
               )._storage;
    } while (pvVar2 != pvVar3 + (ulong)((long)this->_begin_storage - (long)pvVar3) / 0x28);
  }
  this->_free_elem = (elem_ptr_pointer)0x0;
  this->_begin_storage = (void_pointer)0x0;
  operator_delete(pvVar3,(long)(this->
                               super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
                               )._end_storage - (long)pvVar3);
  (this->
  super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  )._storage = (void_pointer)0x0;
  (this->
  super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  )._end_storage = (void_pointer)0x0;
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  ::copy_assign_impl(&this->
                      super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
                     ,rhs);
  begin = (elem_ptr_const_pointer)
          (rhs->
          super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
          )._storage;
  pvVar1 = rhs->_begin_storage;
  pvVar2 = (elem_ptr_pointer)
           (this->
           super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
           )._storage;
  this->_free_elem = pvVar2;
  this->_begin_storage = pvVar2 + (ulong)((long)pvVar1 - (long)begin) / 0x28;
  max_align = rhs->_align_max;
  this->_align_max = max_align;
  poly_uninitialized_copy
            (&local_38,
             &this->
              super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
             ,pvVar2,begin,rhs->_free_elem,(elem_ptr_const_pointer)rhs->_begin_storage,max_align);
  auVar4._0_8_ = local_38.
                 super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_void_*>
                 .
                 super__Head_base<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_false>
                 ._M_head_impl;
  auVar4._8_4_ = (int)local_38.
                      super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_void_*>
                      .
                      super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_void_*>
                      .
                      super__Head_base<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_false>
                      ._M_head_impl;
  auVar4._12_4_ =
       local_38.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_void_*>
       .
       super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_void_*>
       .
       super__Head_base<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>_>_*,_false>
       ._M_head_impl._4_4_;
  this->_free_elem = (elem_ptr_pointer)auVar4._0_8_;
  this->_begin_storage = (void_pointer)auVar4._8_8_;
  return this;
}

Assistant:

inline auto vector<I, A, C>::copy_assign_impl(const vector& rhs) -> vector&
{
    tidy();
    base() = rhs.base();
    init_ptrs(rhs.capacity());
    _align_max = rhs._align_max;
    set_ptrs(poly_uninitialized_copy(
        base(), begin_elem(), rhs.begin_elem(), rhs.end_elem(), rhs.last_elem(), rhs.max_align()));
    return *this;
}